

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

void DrawCircleGradient(int centerX,int centerY,float radius,Color color1,Color color2)

{
  uint uVar1;
  bool bVar2;
  float x;
  float y;
  float fVar3;
  float fVar4;
  
  rlCheckRenderBatchLimit(0x6c);
  rlBegin(4);
  x = (float)centerX;
  y = (float)centerY;
  uVar1 = 0;
  do {
    rlColor4ub(color1.r,color1.g,color1.b,color1.a);
    rlVertex2f(x,y);
    rlColor4ub(color2.r,color2.g,color2.b,color2.a);
    fVar3 = sinf((float)(int)uVar1 * 0.017453292);
    fVar4 = cosf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar3 * radius + x,fVar4 * radius + y);
    rlColor4ub(color2.r,color2.g,color2.b,color2.a);
    fVar3 = (float)(int)(uVar1 + 10) * 0.017453292;
    fVar4 = sinf(fVar3);
    fVar3 = cosf(fVar3);
    rlVertex2f(fVar4 * radius + x,fVar3 * radius + y);
    bVar2 = uVar1 < 0x15e;
    uVar1 = uVar1 + 10;
  } while (bVar2);
  rlEnd();
  return;
}

Assistant:

void DrawCircleGradient(int centerX, int centerY, float radius, Color color1, Color color2)
{
    rlCheckRenderBatchLimit(3*36);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color1.r, color1.g, color1.b, color1.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlColor4ub(color2.r, color2.g, color2.b, color2.a);
            rlVertex2f((float)centerX + sinf(DEG2RAD*i)*radius, (float)centerY + cosf(DEG2RAD*i)*radius);
            rlColor4ub(color2.r, color2.g, color2.b, color2.a);
            rlVertex2f((float)centerX + sinf(DEG2RAD*(i + 10))*radius, (float)centerY + cosf(DEG2RAD*(i + 10))*radius);
        }
    rlEnd();
}